

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::PRE::TraceFailedPreloadInLandingPad
          (PRE *this,Loop *loop,PropertySym *propertySym,char16 *reason)

{
  byte bVar1;
  uint uVar2;
  ThreadContextInfo *pTVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  PropertyRecord *pPVar7;
  undefined4 *puVar8;
  char16_t *_Format;
  ThreadContext *this_02;
  WCHAR local_78 [4];
  char16 propSymStr [32];
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,FieldPREPhase,uVar6,functionId);
  if (!bVar5) {
    return;
  }
  bVar1 = (propertySym->super_Sym).field_0x15;
  if (bVar1 < 4) {
    uVar2 = (propertySym->m_stackSym->super_Sym).m_id;
    switch(bVar1) {
    case 0:
      pTVar3 = propertySym->m_func->m_threadContextInfo;
      this_02 = (ThreadContext *)pTVar3[-3].wellKnownHostTypeIds;
      if (pTVar3 == (ThreadContextInfo *)0x0) {
        this_02 = (ThreadContext *)0x0;
      }
      pPVar7 = ThreadContext::GetPropertyRecord(this_02,propertySym->m_propertyId);
      swprintf_s<32ul>((WCHAR (*) [32])local_78,L"s%d->%s",(ulong)uVar2,pPVar7 + 1);
      goto LAB_0044169f;
    default:
      _Format = L"s%d[%d]";
      break;
    case 2:
      _Format = L"s%dl[%d]";
    }
    swprintf_s<32ul>((WCHAR (*) [32])local_78,_Format,(ulong)uVar2);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4662,"(0)","Unknown field kind");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
LAB_0044169f:
  Output::Print(L"** TRACE: Field PRE: ");
  Func::DumpFullFunctionName(this->globOpt->func);
  uVar6 = Loop::GetLoopNumber(loop);
  Output::Print(L": Failed to pre-load (%s) in landing pad of loop #%d. Reason: %s ",local_78,
                (ulong)uVar6,reason);
  Output::Print(L"\n");
  return;
}

Assistant:

void GlobOpt::PRE::TraceFailedPreloadInLandingPad(const Loop *const loop, PropertySym * propertySym, const char16* reason) const
{
    if (PHASE_TRACE(Js::FieldPREPhase, this->globOpt->func))
    {
        int32 propertyId = propertySym->m_propertyId;
        SymID objectSymId = propertySym->m_stackSym->m_id;
        char16 propSymStr[32];
        switch (propertySym->m_fieldKind)
        {
        case PropertyKindData:
            if (JITManager::GetJITManager()->IsOOPJITEnabled())
            {
                swprintf_s(propSymStr, _u("s%d->#%d"), objectSymId, propertyId);
            }
            else
            {
                Js::PropertyRecord const* fieldName = propertySym->m_func->GetInProcThreadContext()->GetPropertyRecord(propertyId);
                swprintf_s(propSymStr, _u("s%d->%s"), objectSymId, fieldName->GetBuffer());
            }
            break;
        case PropertyKindSlots:
        case PropertyKindSlotArray:
            swprintf_s(propSymStr, _u("s%d[%d]"), objectSymId, propertyId);
            break;
        case PropertyKindLocalSlots:
            swprintf_s(propSymStr, _u("s%dl[%d]"), objectSymId, propertyId);
            break;
        default:
            AssertMsg(0, "Unknown field kind");
            break;
        }

        Output::Print(_u("** TRACE: Field PRE: "));
        this->globOpt->func->DumpFullFunctionName();
        Output::Print(_u(": Failed to pre-load (%s) in landing pad of loop #%d. Reason: %s "), propSymStr, loop->GetLoopNumber(), reason);
        Output::Print(_u("\n"));
    }
}